

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void fstk_RunRept(uint32_t count,int32_t reptLineNo,char *body,size_t size)

{
  bool bVar1;
  size_t size_local;
  char *body_local;
  int32_t reptLineNo_local;
  uint32_t count_local;
  
  if ((count != 0) && (bVar1 = newReptContext(reptLineNo,body,size), bVar1)) {
    contextStack->nbReptIters = count;
    contextStack->forName = (char *)0x0;
  }
  return;
}

Assistant:

void fstk_RunRept(uint32_t count, int32_t reptLineNo, char *body, size_t size)
{
	if (count == 0)
		return;
	if (!newReptContext(reptLineNo, body, size))
		return;

	contextStack->nbReptIters = count;
	contextStack->forName = NULL;
}